

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::VarintCasesWithSizes_ReadVarint64_Test::
~VarintCasesWithSizes_ReadVarint64_Test(VarintCasesWithSizes_ReadVarint64_Test *this)

{
  io::anon_unknown_0::VarintCasesWithSizes_ReadVarint64_Test::
  ~VarintCasesWithSizes_ReadVarint64_Test((VarintCasesWithSizes_ReadVarint64_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, ReadVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadVarint64(&value));
    EXPECT_EQ(kVarintCases_case.value, value);
  }

  EXPECT_EQ(kVarintCases_case.size, input.ByteCount());
}